

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_load_OGL_texture_from_memory
               (uchar *buffer,int buffer_length,int force_channels,uint reuse_texture_ID,uint flags)

{
  uchar *puVar1;
  uint in_R8D;
  uint tex_id;
  int channels;
  int height;
  int width;
  uchar *img;
  uint in_stack_00000074;
  uint in_stack_00000078;
  int in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000084;
  uchar *in_stack_00000088;
  uint in_stack_000000a0;
  uint in_stack_000000a8;
  uint in_stack_000000b0;
  int in_stack_000000b8;
  int in_stack_000000bc;
  uint in_stack_000000c0;
  int in_stack_000000c4;
  uchar *in_stack_000000c8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  uchar *in_stack_ffffffffffffffd0;
  uint local_4;
  
  if (((in_R8D & 0x40) == 0) ||
     (local_4 = SOIL_direct_load_DDS_from_memory
                          (in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                           in_stack_000000b8), local_4 == 0)) {
    puVar1 = SOIL_load_image_from_memory
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                        in_stack_ffffffffffffffc0,
                        (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
    if (puVar1 == (uchar *)0x0) {
      result_string_pointer = stbi_failure_reason();
      local_4 = 0;
    }
    else {
      local_4 = SOIL_internal_create_OGL_texture
                          (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_0000007c,
                           in_stack_00000078,in_stack_00000074,in_stack_000000a0,in_stack_000000a8,
                           in_stack_000000b0);
      SOIL_free_image_data((uchar *)0x115e20);
    }
  }
  return local_4;
}

Assistant:

unsigned int
	SOIL_load_OGL_texture_from_memory
	(
		const unsigned char *const buffer,
		int buffer_length,
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels;
	unsigned int tex_id;
	/*	does the user want direct uploading of the image as a DDS file?	*/
	if( flags & SOIL_FLAG_DDS_LOAD_DIRECT )
	{
		/*	1st try direct loading of the image as a DDS file
			note: direct uploading will only load what is in the
			DDS file, no MIPmaps will be generated, the image will
			not be flipped, etc.	*/
		tex_id = SOIL_direct_load_DDS_from_memory(
				buffer, buffer_length,
				reuse_texture_ID, flags, 0 );
		if( tex_id )
		{
			/*	hey, it worked!!	*/
			return tex_id;
		}
	}
	/*	try to load the image	*/
	img = SOIL_load_image_from_memory(
					buffer, buffer_length,
					&width, &height, &channels,
					force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	OK, make it a texture!	*/
	tex_id = SOIL_internal_create_OGL_texture(
			img, width, height, channels,
			reuse_texture_ID, flags,
			GL_TEXTURE_2D, GL_TEXTURE_2D,
			GL_MAX_TEXTURE_SIZE );
	/*	and nuke the image data	*/
	SOIL_free_image_data( img );
	/*	and return the handle, such as it is	*/
	return tex_id;
}